

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O2

MPP_RET jpege_proc_prep_cfg(MppEncPrepCfg *dst,MppEncPrepCfg *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  RK_S32 RVar5;
  MppFrameChromaDownSampleMode MVar6;
  int iVar7;
  long lVar8;
  MppEncRotationCfg MVar9;
  MppEncRotationCfg MVar10;
  uint uVar11;
  MPP_RET MVar12;
  bool bVar13;
  bool bVar14;
  long lVar15;
  MppEncPrepCfg bak;
  
  uVar1 = src->change;
  if (uVar1 == 0) {
    _mpp_log_l(2,"jpege_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"change",
               "jpege_proc_prep_cfg",0x76);
    if ((mpp_debug._3_1_ & 0x10) == 0) {
      return MPP_OK;
    }
    abort();
  }
  memcpy(&bak,dst,0x84);
  if ((uVar1 & 4) != 0) {
    dst->format = src->format;
    RVar5 = src->fix_chroma_u;
    dst->fix_chroma_en = src->fix_chroma_en;
    dst->fix_chroma_u = RVar5;
    dst->fix_chroma_v = src->fix_chroma_v;
    MVar6 = src->chroma_ds_mode;
    dst->format_out = src->format_out;
    dst->chroma_ds_mode = MVar6;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    dst->range = src->range;
    dst->range_out = src->range_out;
  }
  if ((uVar1 & 0x10) != 0) {
    dst->rotation_ext = src->rotation_ext;
  }
  if ((uVar1 & 0x20) != 0) {
    dst->mirroring_ext = src->mirroring_ext;
  }
  if ((uVar1 & 0x40) != 0) {
    dst->flip = src->flip;
  }
  MVar10 = dst->rotation_ext;
  uVar11 = dst->mirroring_ext;
  if (-1 < (int)uVar11 && MVar10 < MPP_ENC_ROT_BUTT) {
    iVar7 = dst->flip;
    MVar12 = MPP_OK;
    if (-1 < iVar7) goto LAB_001beb98;
  }
  _mpp_log_l(2,"jpege_api_v2","invalid trans: rotation %d, mirroring %d\n",(char *)0x0);
  MVar10 = dst->rotation_ext;
  uVar11 = dst->mirroring_ext;
  iVar7 = dst->flip;
  MVar12 = MPP_ERR_VALUE;
LAB_001beb98:
  MVar9 = MVar10 & MPP_ENC_ROT_270 ^ MPP_ENC_ROT_180;
  uVar2 = (uint)(uVar11 == 0);
  if (iVar7 == 0) {
    MVar9 = MVar10;
    uVar2 = uVar11;
  }
  dst->mirroring = uVar2;
  dst->rotation = MVar9;
  if ((uVar1 & 0x11) == 0) {
    iVar7 = dst->width;
  }
  else {
    if ((MVar9 | MPP_ENC_ROT_180) == MPP_ENC_ROT_270) {
      lVar8 = 4;
      lVar15 = 8;
    }
    else {
      lVar8 = 8;
      lVar15 = 4;
    }
    iVar7 = *(int *)((long)(src->sharpen).coef + lVar15 + -0x68);
    dst->width = iVar7;
    dst->height = *(RK_S32 *)((long)(src->sharpen).coef + lVar8 + -0x68);
    RVar5 = src->ver_stride;
    dst->hor_stride = src->hor_stride;
    dst->ver_stride = RVar5;
  }
  if (iVar7 - 0x2001U < 0xffffe00f) {
    _mpp_log_l(2,"jpege_api_v2","invalid width %d is not in range [16..8192]\n",
               "jpege_proc_prep_cfg");
    MVar12 = MPP_NOK;
  }
  if (dst->height - 0x2001U < 0xffffe00f) {
    MVar12 = MPP_NOK;
    _mpp_log_l(2,"jpege_api_v2","invalid height %d is not in range [16..8192]\n",
               "jpege_proc_prep_cfg");
  }
  dst->change = dst->change | uVar1;
  if ((dst->rotation | MPP_ENC_ROT_180) == MPP_ENC_ROT_270) {
    uVar1 = dst->width;
    uVar11 = dst->height;
    uVar2 = dst->hor_stride;
    bVar4 = (int)uVar2 < (int)uVar11;
    uVar3 = dst->ver_stride;
    bVar14 = SBORROW4(uVar1,uVar3);
    iVar7 = uVar1 - uVar3;
    bVar13 = uVar1 == uVar3;
  }
  else {
    uVar1 = dst->width;
    uVar11 = dst->height;
    uVar2 = dst->hor_stride;
    bVar4 = (int)uVar2 < (int)uVar1;
    uVar3 = dst->ver_stride;
    bVar14 = SBORROW4(uVar11,uVar3);
    iVar7 = uVar11 - uVar3;
    bVar13 = uVar11 == uVar3;
  }
  if ((bool)((!bVar13 && bVar14 == iVar7 < 0) | bVar4)) {
    _mpp_log_l(2,"jpege_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,(ulong)uVar1
               ,(ulong)uVar11,(ulong)uVar2,(ulong)uVar3);
    MVar12 = MPP_ERR_VALUE;
  }
  else if (MVar12 == MPP_OK) {
    if (((byte)jpege_debug & 0x40) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"jpege_api_v2","MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
               (ulong)uVar1,(ulong)uVar11,(ulong)uVar2,(ulong)uVar3);
    return MPP_OK;
  }
  _mpp_log_l(2,"jpege_api_v2","failed to accept new prep config\n","jpege_proc_prep_cfg");
  memcpy(dst,&bak,0x84);
  return MVar12;
}

Assistant:

static MPP_RET jpege_proc_prep_cfg(MppEncPrepCfg *dst, MppEncPrepCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    mpp_assert(change);
    if (change) {
        MppEncPrepCfg bak = *dst;
        RK_S32 mirroring;
        RK_S32 rotation;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FORMAT) {
            dst->format = src->format;
            dst->format_out = src->format_out;
            dst->fix_chroma_en = src->fix_chroma_en;
            dst->fix_chroma_u = src->fix_chroma_u;
            dst->fix_chroma_v = src->fix_chroma_v;
            dst->chroma_ds_mode = src->chroma_ds_mode;
        }

        if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_RANGE) {
            dst->range = src->range;
            dst->range_out = src->range_out;
        }

        if (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)
            dst->rotation_ext = src->rotation_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_MIRRORING)
            dst->mirroring_ext = src->mirroring_ext;

        if (change & MPP_ENC_PREP_CFG_CHANGE_FLIP)
            dst->flip = src->flip;

        // parameter checking
        if (dst->rotation_ext >= MPP_ENC_ROT_BUTT || dst->rotation_ext < 0 ||
            dst->mirroring_ext < 0 || dst->flip < 0) {
            mpp_err("invalid trans: rotation %d, mirroring %d\n", dst->rotation_ext, dst->mirroring_ext);
            ret = MPP_ERR_VALUE;
        }

        rotation = dst->rotation_ext;
        mirroring = dst->mirroring_ext;

        if (dst->flip) {
            mirroring = !mirroring;
            rotation += MPP_ENC_ROT_180;
            rotation &= MPP_ENC_ROT_270;
        }

        dst->mirroring = mirroring;
        dst->rotation = rotation;

        /* jpeg encoder do not have denoise/sharpen feature */

        if ((change & MPP_ENC_PREP_CFG_CHANGE_INPUT) ||
            (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)) {
            if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
                dst->width = src->height;
                dst->height = src->width;
            } else {
                dst->width = src->width;
                dst->height = src->height;
            }
            dst->hor_stride = src->hor_stride;
            dst->ver_stride = src->ver_stride;
        }

        if (dst->width < 16 || dst->width > 8192) {
            mpp_err_f("invalid width %d is not in range [16..8192]\n", dst->width);
            ret = MPP_NOK;
        }

        if (dst->height < 16 || dst->height > 8192) {
            mpp_err_f("invalid height %d is not in range [16..8192]\n", dst->height);
            ret = MPP_NOK;
        }

        dst->change |= change;

        // parameter checking
        if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
            if (dst->height > dst->hor_stride || dst->width > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        } else {
            if (dst->width > dst->hor_stride || dst->height > dst->ver_stride) {
                mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                        dst->width, dst->height, dst->hor_stride, dst->ver_stride);
                ret = MPP_ERR_VALUE;
            }
        }

        if (ret) {
            mpp_err_f("failed to accept new prep config\n");
            *dst = bak;
        } else {
            jpege_dbg_ctrl("MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",
                           dst->width, dst->height,
                           dst->hor_stride, dst->ver_stride);
        }
    }

    return ret;
}